

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AtomicMachine::RunStage(AtomicMachine *this,int stage)

{
  CallLogWrapper *pCVar1;
  float fVar2;
  float fVar3;
  ShaderImageLoadStoreBase *this_00;
  _Alloc_hider _Var4;
  bool bVar5;
  GLint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  char *pcVar9;
  GLenum in_ECX;
  GLenum GVar10;
  int in_EDX;
  int stage_00;
  int stage_01;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  int i_1;
  float *pfVar11;
  GLsizei GVar12;
  long lVar13;
  GLenum *pGVar14;
  int i;
  ulong uVar15;
  GLuint buffer;
  GLuint texture_result;
  string source;
  GLuint textures [7];
  char *src;
  undefined8 uStack_80;
  undefined4 uStack_78;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  vec4 color;
  float afStack_48 [2];
  float afStack_40 [4];
  
  this_00 = (ShaderImageLoadStoreBase *)(ulong)(uint)stage;
  bVar5 = ShaderImageLoadStoreBase::SupportedInStage
                    (&this->super_ShaderImageLoadStoreBase,stage,in_EDX);
  lVar13 = 0x10;
  if (bVar5) {
    GVar10 = (&switchD_009bf126::switchdataD_01a66d4c)[(long)this_00] + 0x1a66d4c;
    switch(this_00) {
    case (ShaderImageLoadStoreBase *)0x0:
      GenShader<int>(&source,(AtomicMachine *)0x0,stage_00,GVar10);
      GVar8 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,source._M_dataplus._M_p,(char *)0x0,
                         (char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x1:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000001,stage_00,GVar10);
      GVar8 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         source._M_dataplus._M_p,
                         "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                         (char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x2:
      GenShader<int>(&source,(AtomicMachine *)0x2,stage_00,GVar10);
      GVar8 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         (char *)0x0,source._M_dataplus._M_p,(char *)0x0,(char *)0x0,(bool *)0x0);
      break;
    case (ShaderImageLoadStoreBase *)0x3:
      GenShader<int>(&source,(AtomicMachine *)0x3,stage_00,GVar10);
      GVar8 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,"#version 420 core\nvoid main() {}",
                         (char *)0x0,(char *)0x0,source._M_dataplus._M_p,(char *)0x0,(bool *)0x0);
      break;
    default:
      GenShader<int>(&source,(AtomicMachine *)&DAT_00000004,stage_00,in_ECX);
      src = source._M_dataplus._M_p;
      pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper;
      GVar7 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar7,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar7);
      GVar8 = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,GVar8,GVar7);
      glu::CallLogWrapper::glLinkProgram(pCVar1,GVar8);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)source._M_dataplus._M_p != &source.field_2) {
      operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
    glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
    glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
    pGVar14 = &DAT_01a672c0;
    uVar15 = 0;
    do {
      GVar10 = *pGVar14;
      glu::CallLogWrapper::glBindTexture(pCVar1,GVar10,textures[uVar15]);
      if (uVar15 == 4) {
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
        glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
        glu::CallLogWrapper::glTexBuffer(pCVar1,GVar10,0x8235,buffer);
        goto switchD_009bf385_caseD_4;
      }
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2800,0x2600);
      switch(uVar15 & 0xffffffff) {
      case 0:
      case 2:
        goto LAB_009bf3e4;
      case 1:
      case 6:
        glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar10,1,0x8235,1,1,2);
        break;
      case 3:
        GVar10 = 0x8513;
LAB_009bf3e4:
        GVar12 = 1;
LAB_009bf3fa:
        glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar10,1,0x8235,1,GVar12);
        break;
      case 5:
        GVar10 = 0x8c18;
        GVar12 = 2;
        goto LAB_009bf3fa;
      }
switchD_009bf385_caseD_4:
      uVar15 = uVar15 + 1;
      pGVar14 = pGVar14 + 1;
    } while (uVar15 != 7);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8235);
    glu::CallLogWrapper::glUseProgram(pCVar1,GVar8);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_result");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_3d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,2);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2drect");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,3);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_cube");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_buffer");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,5);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_1darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,6);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,7);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
    if (stage - 1U < 2) {
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
      glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
    }
    else if (stage == 4) {
      glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
    }
    else {
      glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
    }
    color.m_data[0] = 0.0;
    color.m_data[1] = 0.0;
    color.m_data[2] = 0.0;
    color.m_data[3] = 0.0;
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
    glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
    lVar13 = 0;
    GVar10 = 0x1908;
    glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
    source._M_dataplus._M_p = (pointer)0x3f80000000000000;
    source._M_string_length = 0x3f80000000000000;
    bVar5 = true;
    do {
      while (!bVar5) {
        lVar13 = lVar13 + 1;
        bVar5 = false;
        if (lVar13 == 4) {
          lVar13 = FUN_009bf809();
          return lVar13;
        }
      }
      fVar2 = color.m_data[lVar13];
      fVar3 = (float)textures[lVar13 + -8];
      bVar5 = fVar2 == fVar3;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
      pfVar11 = afStack_48;
      afStack_48[0] = color.m_data[0];
      afStack_48[1] = color.m_data[1];
      afStack_40[0] = color.m_data[2];
      afStack_40[1] = color.m_data[3];
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&source,pfVar11,v);
      _Var4 = source._M_dataplus;
      uStack_78 = 0x69323372;
      uStack_80 = 4;
      uStack_74 = 0;
      src = (char *)&uStack_78;
      pcVar9 = ShaderImageLoadStoreBase::StageName(this_00,(int)pfVar11);
      anon_unknown_0::Output
                ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var4._M_p,&uStack_78,pcVar9);
      if (src != (char *)&uStack_78) {
        operator_delete(src,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,uStack_78))) +
                            1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar8);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      lVar13 = -1;
    }
    else {
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar8);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      if ((uint)stage < 4) {
        lVar13 = (*(code *)(&DAT_01a66d78 + *(int *)(&DAT_01a66d78 + (long)this_00 * 4)))();
        return lVar13;
      }
      GenShader<unsigned_int>(&source,(AtomicMachine *)&DAT_00000004,stage_01,GVar10);
      src = source._M_dataplus._M_p;
      GVar7 = glu::CallLogWrapper::glCreateShader(pCVar1,0x91b9);
      glu::CallLogWrapper::glShaderSource(pCVar1,GVar7,1,&src,(GLint *)0x0);
      glu::CallLogWrapper::glCompileShader(pCVar1,GVar7);
      GVar8 = glu::CallLogWrapper::glCreateProgram(pCVar1);
      glu::CallLogWrapper::glAttachShader(pCVar1,GVar8,GVar7);
      glu::CallLogWrapper::glLinkProgram(pCVar1,GVar8);
      glu::CallLogWrapper::glDeleteShader(pCVar1,GVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glGenTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(pCVar1,0xde1,1,0x8814,1,1);
      glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
      pGVar14 = &DAT_01a672c0;
      uVar15 = 0;
      do {
        GVar10 = *pGVar14;
        glu::CallLogWrapper::glBindTexture(pCVar1,GVar10,textures[uVar15]);
        if (uVar15 == 4) {
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
          glu::CallLogWrapper::glBufferData(pCVar1,0x8c2a,4,(void *)0x0,0x88e8);
          glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
          glu::CallLogWrapper::glTexBuffer(pCVar1,GVar10,0x8236,buffer);
          goto switchD_009bfb92_caseD_4;
        }
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(pCVar1,GVar10,0x2800,0x2600);
        switch(uVar15 & 0xffffffff) {
        case 0:
        case 2:
          goto LAB_009bfbf1;
        case 1:
        case 6:
          glu::CallLogWrapper::glTexStorage3D(pCVar1,GVar10,1,0x8236,1,1,2);
          break;
        case 3:
          GVar10 = 0x8513;
LAB_009bfbf1:
          GVar12 = 1;
LAB_009bfc07:
          glu::CallLogWrapper::glTexStorage2D(pCVar1,GVar10,1,0x8236,1,GVar12);
          break;
        case 5:
          GVar10 = 0x8c18;
          GVar12 = 2;
          goto LAB_009bfc07;
        }
switchD_009bfb92_caseD_4:
        uVar15 = uVar15 + 1;
        pGVar14 = pGVar14 + 1;
      } while (uVar15 != 7);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,texture_result,0,'\0',0,0x88b9,0x8814);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[1],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[2],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[3],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[4],0,'\0',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[5],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,7,textures[6],0,'\x01',0,0x88ba,0x8236);
      glu::CallLogWrapper::glUseProgram(pCVar1,GVar8);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_result");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,0);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,2);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,3);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_cube");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_buffer");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,5);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,6);
      GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar8,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,7);
      glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
      if (stage - 1U < 2) {
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,1);
        glu::CallLogWrapper::glDrawArrays(pCVar1,0xe,0,1);
        glu::CallLogWrapper::glPatchParameteri(pCVar1,0x8e72,3);
      }
      else if (stage == 4) {
        glu::CallLogWrapper::glDispatchCompute(pCVar1,1,1,1);
      }
      else {
        glu::CallLogWrapper::glDrawArrays(pCVar1,0,0,1);
      }
      color.m_data[0] = 0.0;
      color.m_data[1] = 0.0;
      color.m_data[2] = 0.0;
      color.m_data[3] = 0.0;
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,texture_result);
      glu::CallLogWrapper::glMemoryBarrier(pCVar1,0x100);
      lVar13 = 0;
      glu::CallLogWrapper::glGetTexImage(pCVar1,0xde1,0,0x1908,0x1406,&color);
      source._M_dataplus._M_p = (pointer)0x3f80000000000000;
      source._M_string_length = 0x3f80000000000000;
      bVar5 = true;
      do {
        while (bVar5) {
          fVar2 = color.m_data[lVar13];
          fVar3 = (float)textures[lVar13 + -8];
          bVar5 = fVar2 == fVar3;
          lVar13 = lVar13 + 1;
          if (lVar13 == 4) {
            if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
              lVar13 = 0;
              goto LAB_009c000a;
            }
            goto LAB_009bff70;
          }
        }
        lVar13 = lVar13 + 1;
        bVar5 = false;
      } while (lVar13 != 4);
LAB_009bff70:
      pfVar11 = afStack_48;
      afStack_48[0] = color.m_data[0];
      afStack_48[1] = color.m_data[1];
      afStack_40[0] = color.m_data[2];
      afStack_40[1] = color.m_data[3];
      gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&source,pfVar11,v_00);
      _Var4 = source._M_dataplus;
      uStack_78 = 0x75323372;
      uStack_74 = 0x69;
      uStack_73 = 0;
      uStack_80 = 5;
      src = (char *)&uStack_78;
      pcVar9 = ShaderImageLoadStoreBase::StageName(this_00,(int)pfVar11);
      anon_unknown_0::Output
                ("Color is: %s. Format is: %s. Stage is: %s.\n",_Var4._M_p,&uStack_78,pcVar9);
      if (src != (char *)&uStack_78) {
        operator_delete(src,CONCAT26(uStack_72,CONCAT15(uStack_73,CONCAT14(uStack_74,uStack_78))) +
                            1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source._M_dataplus._M_p != &source.field_2) {
        operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
      }
      lVar13 = -1;
LAB_009c000a:
      glu::CallLogWrapper::glUseProgram(pCVar1,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar8);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,1,&texture_result);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
    }
  }
  return lVar13;
}

Assistant:

long RunStage(int stage)
	{
		if (!SupportedInStage(stage, 8))
			return NOT_SUPPORTED;
		if (!Atomic<GLint>(stage, GL_R32I))
			return ERROR;
		if (!Atomic<GLuint>(stage, GL_R32UI))
			return ERROR;
		return NO_ERROR;
	}